

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<int,_4> *expected_value)

{
  ostream *poVar1;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream os;
  Vector<int,_4> *expected_value_local;
  GLenum internalformat_local;
  int stage_local;
  LoadStoreMachine *this_local;
  
  os._368_8_ = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"#version 420 core");
  if (stage == 4) {
    std::operator<<((ostream *)local_1a0,"\n#extension GL_ARB_compute_shader : require");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_210,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_230,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_250,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_270,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"image2DRect g_image_2drect;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_290,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_2b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_2f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
  poVar1 = std::operator<<(poVar1,"image1DArray g_image_1darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_310,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_310);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_330,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_330);
  poVar1 = std::operator<<(poVar1,"image2DArray g_image_2darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_350,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_350);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_370,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_370);
  poVar1 = std::operator<<(poVar1,
                           "imageCubeArray g_image_cube_array;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_390,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_390);
  poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_3b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3b0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<int,_4> *)os._368_8_);
  std::operator<<(poVar1,";\nuniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);");
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (stage == 0) {
    std::operator<<((ostream *)local_1a0,
                    "\nvoid main() {\n  ivec2 coord = ivec2(gl_VertexID, g_index[0]);");
  }
  else if (stage == 1) {
    std::operator<<((ostream *)local_1a0,
                    "\nlayout(vertices = 1) out;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);"
                   );
  }
  else if (stage == 2) {
    std::operator<<((ostream *)local_1a0,
                    "\nlayout(quads, point_mode) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);"
                   );
  }
  else if (stage == 3) {
    std::operator<<((ostream *)local_1a0,
                    "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main() {\n  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_index[0]);"
                   );
  }
  else if (stage == 4) {
    std::operator<<((ostream *)local_1a0,
                    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);"
                   );
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\n  vec4 r = vec4(0, 1, 0, 1);\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_3d0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3d0);
  std::operator<<(poVar1,
                  "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_1darray, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  imageStore(g_image_result, coord, r);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DArray g_image_2darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCubeArray g_image_cube_array;" NL "layout(rgba32f) writeonly uniform image2D g_image_result;" NL
			  "uniform "
		   << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4" << expected_value
		   << ";" NL "uniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0, 1, 0, 1);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_2drect, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_1darray, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  imageStore(g_image_result, coord, r);" NL "}";
		return os.str();
	}